

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArrayIndexSnapshotEnumerator.cpp
# Opt level: O1

void __thiscall
Js::JavascriptArrayIndexSnapshotEnumerator::JavascriptArrayIndexSnapshotEnumerator
          (JavascriptArrayIndexSnapshotEnumerator *this,JavascriptArray *arrayObject,
          EnumeratorFlags flags,ScriptContext *scriptContext)

{
  JavascriptArrayIndexEnumeratorBase::JavascriptArrayIndexEnumeratorBase
            (&this->super_JavascriptArrayIndexEnumeratorBase,arrayObject,flags,scriptContext);
  (this->super_JavascriptArrayIndexEnumeratorBase).super_JavascriptEnumerator.super_RecyclableObject
  .super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_0150e598;
  this->initialLength = (arrayObject->super_ArrayObject).length;
  (this->super_JavascriptArrayIndexEnumeratorBase).index = 0xffffffff;
  (this->super_JavascriptArrayIndexEnumeratorBase).doneArray = false;
  this->initialLength =
       (((this->super_JavascriptArrayIndexEnumeratorBase).arrayObject.ptr)->super_ArrayObject).
       length;
  return;
}

Assistant:

JavascriptArrayIndexSnapshotEnumerator::JavascriptArrayIndexSnapshotEnumerator(
        JavascriptArray* arrayObject, EnumeratorFlags flags, ScriptContext* scriptContext) :
        JavascriptArrayIndexEnumeratorBase(arrayObject, flags, scriptContext),
        initialLength(arrayObject->GetLength())
    {
        Reset();
    }